

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O0

bool __thiscall
ON_PlaneSurface::CreatePseudoInfinitePlane
          (ON_PlaneSurface *this,ON_Plane *plane,int point_count,ON_3dPoint *point_list,
          double padding)

{
  double dVar1;
  double dVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  bool bVar14;
  int iVar15;
  ON_Interval *local_b0;
  int local_84;
  int i;
  double local_68;
  double t;
  double s;
  double dStack_50;
  ON_Interval local_48;
  double local_38;
  double padding_local;
  ON_3dPoint *point_list_local;
  ON_Plane *pOStack_20;
  int point_count_local;
  ON_Plane *plane_local;
  ON_PlaneSurface *this_local;
  
  local_38 = padding;
  padding_local = (double)point_list;
  point_list_local._4_4_ = point_count;
  pOStack_20 = plane;
  plane_local = (ON_Plane *)this;
  bVar14 = ON_Plane::IsValid(plane);
  if (bVar14) {
    if (point_list_local._4_4_ < 1) {
      this_local._7_1_ = false;
    }
    else if (padding_local == 0.0) {
      this_local._7_1_ = false;
    }
    else {
      bVar14 = ON_IsValid(local_38);
      if ((!bVar14) || (local_38 < 0.0)) {
        this_local._7_1_ = false;
      }
      else {
        local_b0 = (ON_Interval *)&s;
        do {
          ON_Interval::ON_Interval(local_b0);
          local_b0 = local_b0 + 1;
        } while (local_b0 != (ON_Interval *)&stack0xffffffffffffffc8);
        t = -1.23432101234321e+308;
        local_68 = -1.23432101234321e+308;
        bVar14 = ON_Plane::ClosestPointTo(pOStack_20,*(ON_3dPoint *)padding_local,&t,&local_68);
        if (((bVar14) && (bVar14 = ON_IsValid(t), bVar14)) &&
           (bVar14 = ON_IsValid(local_68), bVar14)) {
          s = t;
          dStack_50 = t;
          local_48.m_t[0] = local_68;
          local_48.m_t[1] = local_68;
          for (local_84 = 1; dVar2 = local_38, local_84 < point_list_local._4_4_;
              local_84 = local_84 + 1) {
            t = -1.23432101234321e+308;
            local_68 = -1.23432101234321e+308;
            bVar14 = ON_Plane::ClosestPointTo
                               (pOStack_20,
                                *(ON_3dPoint *)((long)padding_local + (long)local_84 * 0x18),&t,
                                &local_68);
            if (((!bVar14) || (bVar14 = ON_IsValid(t), !bVar14)) ||
               (bVar14 = ON_IsValid(local_68), !bVar14)) {
              return false;
            }
            if (s <= t) {
              if (dStack_50 < t) {
                dStack_50 = t;
              }
            }
            else {
              s = t;
            }
            if (local_48.m_t[0] <= local_68) {
              if (local_48.m_t[1] < local_68) {
                local_48.m_t[1] = local_68;
              }
            }
            else {
              local_48.m_t[0] = local_68;
            }
          }
          dVar1 = ON_Interval::Length((ON_Interval *)&s);
          t = dVar2 * dVar1 + local_38;
          if ((t <= 0.0) && (bVar14 = ON_Interval::IsIncreasing((ON_Interval *)&s), !bVar14)) {
            t = 1.0;
          }
          dVar1 = local_38;
          s = s - t;
          dStack_50 = t + dStack_50;
          dVar2 = ON_Interval::Length(&local_48);
          local_68 = dVar1 * dVar2 + local_38;
          if ((local_68 <= 0.0) && (bVar14 = ON_Interval::IsIncreasing(&local_48), !bVar14)) {
            local_68 = 1.0;
          }
          local_48.m_t[0] = local_48.m_t[0] - local_68;
          local_48.m_t[1] = local_48.m_t[1] + local_68;
          dVar2 = (pOStack_20->plane_equation).d;
          (this->m_plane).plane_equation.z = (pOStack_20->plane_equation).z;
          (this->m_plane).plane_equation.d = dVar2;
          dVar2 = (pOStack_20->plane_equation).y;
          (this->m_plane).plane_equation.x = (pOStack_20->plane_equation).x;
          (this->m_plane).plane_equation.y = dVar2;
          dVar2 = (pOStack_20->zaxis).z;
          (this->m_plane).zaxis.y = (pOStack_20->zaxis).y;
          (this->m_plane).zaxis.z = dVar2;
          dVar2 = (pOStack_20->zaxis).x;
          (this->m_plane).yaxis.z = (pOStack_20->yaxis).z;
          (this->m_plane).zaxis.x = dVar2;
          dVar2 = (pOStack_20->origin).x;
          dVar1 = (pOStack_20->origin).y;
          uVar3 = *(undefined4 *)&(pOStack_20->origin).z;
          uVar4 = *(undefined4 *)((long)&(pOStack_20->origin).z + 4);
          uVar5 = *(undefined4 *)&(pOStack_20->xaxis).x;
          uVar6 = *(undefined4 *)((long)&(pOStack_20->xaxis).x + 4);
          uVar7 = *(undefined4 *)&(pOStack_20->xaxis).y;
          uVar8 = *(undefined4 *)((long)&(pOStack_20->xaxis).y + 4);
          uVar9 = *(undefined4 *)&(pOStack_20->xaxis).z;
          uVar10 = *(undefined4 *)((long)&(pOStack_20->xaxis).z + 4);
          uVar11 = *(undefined4 *)((long)&(pOStack_20->yaxis).x + 4);
          uVar12 = *(undefined4 *)&(pOStack_20->yaxis).y;
          uVar13 = *(undefined4 *)((long)&(pOStack_20->yaxis).y + 4);
          *(undefined4 *)&(this->m_plane).yaxis.x = *(undefined4 *)&(pOStack_20->yaxis).x;
          *(undefined4 *)((long)&(this->m_plane).yaxis.x + 4) = uVar11;
          *(undefined4 *)&(this->m_plane).yaxis.y = uVar12;
          *(undefined4 *)((long)&(this->m_plane).yaxis.y + 4) = uVar13;
          *(undefined4 *)&(this->m_plane).xaxis.y = uVar7;
          *(undefined4 *)((long)&(this->m_plane).xaxis.y + 4) = uVar8;
          *(undefined4 *)&(this->m_plane).xaxis.z = uVar9;
          *(undefined4 *)((long)&(this->m_plane).xaxis.z + 4) = uVar10;
          *(undefined4 *)&(this->m_plane).origin.z = uVar3;
          *(undefined4 *)((long)&(this->m_plane).origin.z + 4) = uVar4;
          *(undefined4 *)&(this->m_plane).xaxis.x = uVar5;
          *(undefined4 *)((long)&(this->m_plane).xaxis.x + 4) = uVar6;
          (this->m_plane).origin.x = dVar2;
          (this->m_plane).origin.y = dVar1;
          *(double *)&this->field_0x90 = s;
          *(double *)&this->field_0x98 = dStack_50;
          *(double *)&this->field_0xa0 = local_48.m_t[0];
          *(double *)&this->field_0xa8 = local_48.m_t[1];
          *(double *)&this->field_0xb0 = s;
          *(double *)&this->field_0xb8 = dStack_50;
          *(double *)&this->field_0xc0 = local_48.m_t[0];
          *(double *)&this->field_0xc8 = local_48.m_t[1];
          iVar15 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6])
                             (this,0);
          this_local._7_1_ = (bool)(-(char)iVar15 & 1);
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_PlaneSurface::CreatePseudoInfinitePlane( 
        const ON_Plane& plane,
        int point_count,
        const ON_3dPoint* point_list,
        double padding
        )
{
  if ( !plane.IsValid() )
    return false;
  if ( point_count < 1 )
    return false;
  if ( 0 == point_list )
    return false;
  if ( !ON_IsValid(padding) || padding < 0.0 )
    return false;

  ON_Interval plane_domain[2];
  double s, t;
  s = ON_UNSET_VALUE;
  t = ON_UNSET_VALUE;
  if ( !plane.ClosestPointTo( point_list[0], &s, &t ) || !ON_IsValid(s) || !ON_IsValid(t) )
    return 0;
  plane_domain[0].m_t[1] = plane_domain[0].m_t[0] = s;
  plane_domain[1].m_t[1] = plane_domain[1].m_t[0] = t;
  
  for ( int i = 1; i < point_count; i++ )
  {
    s = ON_UNSET_VALUE;
    t = ON_UNSET_VALUE;
    if ( !plane.ClosestPointTo( point_list[i], &s, &t ) || !ON_IsValid(s) || !ON_IsValid(t) )
      return 0;
    if ( s < plane_domain[0].m_t[0] ) plane_domain[0].m_t[0] = s; else if ( s > plane_domain[0].m_t[1] ) plane_domain[0].m_t[1] = s;
    if ( t < plane_domain[1].m_t[0] ) plane_domain[1].m_t[0] = t; else if ( t > plane_domain[1].m_t[1] ) plane_domain[1].m_t[1] = t;
  }

  s = padding*plane_domain[0].Length() + padding;
  if ( !(s > 0.0) && !plane_domain[0].IsIncreasing() )
    s = 1.0;
  plane_domain[0].m_t[0] -= s;
  plane_domain[0].m_t[1] += s;

  t = padding*plane_domain[1].Length() + padding;
  if ( !(t > 0.0) && !plane_domain[1].IsIncreasing() )
    t = 1.0;
  plane_domain[1].m_t[0] -= t;
  plane_domain[1].m_t[1] += t;

  m_plane = plane;
  m_domain[0] = plane_domain[0];
  m_domain[1] = plane_domain[1];
  m_extents[0] = plane_domain[0];
  m_extents[1] = plane_domain[1];

  return IsValid()?true:false;
}